

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.C
# Opt level: O1

StringList * __thiscall
Config::values(StringList *__return_storage_ptr__,Config *this,string *section)

{
  const_iterator cVar1;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<String,_std::allocator<String>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<String,_std::allocator<String>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<String,_std::allocator<String>_>_>_>_>
          ::find(&(this->_sections)._M_t,section);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->_sections)._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->super__List_base<String,_std::allocator<String>_>)._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)0x0;
    (__return_storage_ptr__->super__List_base<String,_std::allocator<String>_>)._M_impl._M_node.
    super__List_node_base._M_prev = (_List_node_base *)0x0;
    (__return_storage_ptr__->super__List_base<String,_std::allocator<String>_>)._M_impl._M_node.
    _M_size = 0;
    (__return_storage_ptr__->super__List_base<String,_std::allocator<String>_>)._M_impl._M_node.
    super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
    (__return_storage_ptr__->super__List_base<String,_std::allocator<String>_>)._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  }
  else {
    std::__cxx11::list<String,_std::allocator<String>_>::list
              (__return_storage_ptr__,(list<String,_std::allocator<String>_> *)(cVar1._M_node + 2));
  }
  return __return_storage_ptr__;
}

Assistant:

StringList Config::values(std::string const & section) const
{
    SectionsMap::const_iterator it = _sections.find(section);
    if (it == _sections.end()) {
        return StringList();
    }
    return it->second;
}